

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * io_read_all_str(IOHANDLE io)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint len;
  void *buffer;
  uint *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  IOHANDLE in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  io_read_all(in_stack_fffffffffffffff0,
              (void **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
              in_stack_ffffffffffffffe0);
  iVar2 = mem_has_null(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  if (iVar2 != 0) {
    free(in_stack_fffffffffffffff0);
    in_stack_fffffffffffffff0 = (IOHANDLE)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (char *)in_stack_fffffffffffffff0;
}

Assistant:

char *io_read_all_str(IOHANDLE io)
{
	void *buffer;
	unsigned len;

	io_read_all(io, &buffer, &len);
	if(mem_has_null(buffer, len))
	{
		free(buffer);
		return 0;
	}
	return buffer;
}